

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestCompressionF<Counter<unsigned_short,16u>,Counter<unsigned_char,8u>>(int bias)

{
  ushort uVar1;
  ushort uVar2;
  uint recent;
  uint uVar3;
  int iVar4;
  short sVar5;
  Counter<unsigned_short,_16U> fullOriginal;
  uint uVar6;
  uint uVar7;
  ushort uVar8;
  ushort uVar9;
  bool bVar10;
  
  iVar4 = 0;
  sVar5 = 0;
  bVar10 = false;
  uVar6 = 0;
  do {
    uVar1 = (ushort)uVar6 & 0xff;
    uVar3 = 0;
    uVar7 = uVar6;
    do {
      if (uVar3 < uVar6) {
        if ((int)uVar7 < 0x80 - bias) {
LAB_0010235a:
          uVar2 = (ushort)uVar3;
          uVar8 = uVar2 & 0x100 | uVar1;
          uVar9 = uVar2 & 0xff;
          if (uVar9 < uVar1) {
            if ((ushort)(0x80 - bias) <= (ushort)(uVar1 - uVar9)) {
              uVar8 = uVar8 - 0x100;
            }
          }
          else if ((ushort)(bias + 0x80) < (ushort)(uVar9 - uVar1)) {
            uVar8 = uVar8 + 0x100;
          }
          if (uVar8 != (ushort)uVar6) {
            return bVar10;
          }
          if ((bias == 0) && ((ushort)(sVar5 - (char)uVar7) != uVar2)) {
            return bVar10;
          }
        }
      }
      else if ((int)(iVar4 + uVar3) <= bias + 0x80) goto LAB_0010235a;
      uVar3 = uVar3 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar3 != 0x200);
    bVar10 = 0x1fe < uVar6;
    uVar6 = uVar6 + 1;
    sVar5 = sVar5 + 1;
    iVar4 = iVar4 + -1;
    if (uVar6 == 0x200) {
      return true;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}